

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateSerializeWithCachedSizesToArray
          (MessageGenerator *this,Printer *printer)

{
  LogMessage *other;
  bool bVar1;
  LogFinisher local_59;
  LogMessage local_58;
  
  if (*(char *)(*(long *)(this->descriptor_ + 0x20) + 0x68) == '\x01') {
    io::Printer::Print(printer,
                       "::google::protobuf::uint8* $classname$::InternalSerializeWithCachedSizesToArray(\n    bool deterministic, ::google::protobuf::uint8* target) const {\n  target = _extensions_.InternalSerializeMessageSetWithCachedSizesToArray(\n               deterministic, target);\n"
                       ,"classname",&this->classname_);
    if ((this->options_).enforce_lite == false) {
      bVar1 = *(int *)(*(long *)(*(long *)(this->descriptor_ + 0x10) + 0xa0) + 0xa8) != 3;
    }
    else {
      bVar1 = false;
    }
    if (!bVar1) {
      internal::LogMessage::LogMessage
                (&local_58,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                 ,0xe75);
      other = internal::LogMessage::operator<<
                        (&local_58,
                         "CHECK failed: UseUnknownFieldSet(descriptor_->file(), options_): ");
      internal::LogFinisher::operator=(&local_59,other);
      internal::LogMessage::~LogMessage(&local_58);
    }
    io::Printer::Print(printer,
                       "  target = ::google::protobuf::internal::WireFormat::\n             SerializeUnknownMessageSetItemsToArray(\n               unknown_fields(), target);\n"
                      );
  }
  else {
    io::Printer::Print(printer,
                       "::google::protobuf::uint8* $classname$::InternalSerializeWithCachedSizesToArray(\n    bool deterministic, ::google::protobuf::uint8* target) const {\n"
                       ,"classname",&this->classname_);
    io::Printer::Indent(printer);
    io::Printer::Print(printer,"// @@protoc_insertion_point(serialize_to_array_start:$full_name$)\n"
                       ,"full_name",*(string **)(this->descriptor_ + 8));
    GenerateSerializeWithCachedSizesBody(this,printer,true);
    io::Printer::Print(printer,"// @@protoc_insertion_point(serialize_to_array_end:$full_name$)\n",
                       "full_name",*(string **)(this->descriptor_ + 8));
    io::Printer::Outdent(printer);
  }
  io::Printer::Print(printer,"  return target;\n}\n");
  return;
}

Assistant:

void MessageGenerator::
GenerateSerializeWithCachedSizesToArray(io::Printer* printer) {
  if (descriptor_->options().message_set_wire_format()) {
    // Special-case MessageSet.
    printer->Print(
      "::google::protobuf::uint8* $classname$::InternalSerializeWithCachedSizesToArray(\n"
      "    bool deterministic, ::google::protobuf::uint8* target) const {\n"
      "  target = _extensions_."
      "InternalSerializeMessageSetWithCachedSizesToArray(\n"
      "               deterministic, target);\n",
      "classname", classname_);
    GOOGLE_CHECK(UseUnknownFieldSet(descriptor_->file(), options_));
    printer->Print(
      "  target = ::google::protobuf::internal::WireFormat::\n"
      "             SerializeUnknownMessageSetItemsToArray(\n"
      "               unknown_fields(), target);\n");
    printer->Print(
      "  return target;\n"
      "}\n");
    return;
  }

  printer->Print(
    "::google::protobuf::uint8* $classname$::InternalSerializeWithCachedSizesToArray(\n"
    "    bool deterministic, ::google::protobuf::uint8* target) const {\n",
    "classname", classname_);
  printer->Indent();

  printer->Print(
    "// @@protoc_insertion_point(serialize_to_array_start:$full_name$)\n",
    "full_name", descriptor_->full_name());

  GenerateSerializeWithCachedSizesBody(printer, true);

  printer->Print(
    "// @@protoc_insertion_point(serialize_to_array_end:$full_name$)\n",
    "full_name", descriptor_->full_name());

  printer->Outdent();
  printer->Print(
    "  return target;\n"
    "}\n");
}